

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::LdExp::doApply
          (Interval *__return_storage_ptr__,LdExp *this,EvalContext *ctx,IArgs *iargs)

{
  Interval *pIVar1;
  Exp2 *pEVar2;
  Mul *pMVar3;
  Interval ret;
  undefined1 local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  undefined1 local_68 [8];
  double local_60;
  double local_58;
  Interval *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  pIVar1 = iargs->b;
  pEVar2 = instance<deqp::gls::BuiltinPrecisionTests::Functions::Exp2>();
  local_38 = &local_6b;
  local_50 = pIVar1;
  local_48 = &local_69;
  local_40 = &local_6a;
  (*(pEVar2->super_ExpFunc).super_CFloatFunc1.super_FloatFunc1.
    super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    .
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    .super_FuncBase._vptr_FuncBase[8])(local_68,pEVar2,ctx);
  if ((local_58 == INFINITY && !NAN(local_60)) || (!NAN(local_58) && local_60 == -INFINITY)) {
    if (INFINITY <= local_60) {
      local_60 = INFINITY;
    }
    if (local_58 <= -INFINITY) {
      local_58 = -INFINITY;
    }
    local_68[0] = 1;
  }
  pIVar1 = iargs->a;
  pMVar3 = instance<deqp::gls::BuiltinPrecisionTests::Functions::Mul>();
  local_50 = pIVar1;
  local_48 = local_68;
  local_40 = &local_69;
  local_38 = &local_6a;
  (**(code **)((long)*pMVar3 + 0x40))(__return_storage_ptr__,pMVar3,ctx);
  return __return_storage_ptr__;
}

Assistant:

Interval	doApply			(const EvalContext& ctx, const IArgs& iargs) const
	{
		Interval	ret = call<Exp2>(ctx, iargs.b);
		// Khronos bug 11180 consensus: if exp2(exponent) cannot be represented,
		// the result is undefined.

		if (ret.contains(TCU_INFINITY) | ret.contains(-TCU_INFINITY))
			ret |= TCU_NAN;

		return call<Mul>(ctx, iargs.a, ret);
	}